

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O3

int Ssw_ManGetSatVarValue(Ssw_Man_t *p,Aig_Obj_t *pObj,int f)

{
  Aig_Obj_t *pAVar1;
  int v;
  uint uVar2;
  ulong uVar3;
  
  pAVar1 = p->pNodeToFrames[pObj->Id * p->nFrames + f];
  uVar3 = (ulong)pAVar1 & 0xfffffffffffffffe;
  v = Ssw_ObjSatNum((Ssw_Sat_t *)p->pMSat->vSatVars,(Aig_Obj_t *)(ulong)*(uint *)(uVar3 + 0x24));
  if (v == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = sat_solver_var_value(p->pMSat->pSat,v);
    uVar2 = uVar2 ^ (uint)pAVar1 & 1;
  }
  if (p->pPars->fPolarFlip != 0) {
    uVar2 = uVar2 ^ *(uint *)(uVar3 + 0x18) >> 3 & 1;
  }
  return uVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Retrives value of the PI in the original AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ssw_ManGetSatVarValue( Ssw_Man_t * p, Aig_Obj_t * pObj, int f )
{
    int fUseNoBoundary = 0;
    Aig_Obj_t * pObjFraig;
    int Value;
//    assert( Aig_ObjIsCi(pObj) );
    pObjFraig = Ssw_ObjFrame( p, pObj, f );
    if ( fUseNoBoundary )
    {
        Value = Ssw_CnfGetNodeValue( p->pMSat, Aig_Regular(pObjFraig) );
        Value ^= Aig_IsComplement(pObjFraig);
    }
    else
    {
        int nVarNum = Ssw_ObjSatNum( p->pMSat, Aig_Regular(pObjFraig) );
        Value = (!nVarNum)? 0 : (Aig_IsComplement(pObjFraig) ^ sat_solver_var_value( p->pMSat->pSat, nVarNum ));
    }

//    Value = (Aig_IsComplement(pObjFraig) ^ ((!nVarNum)? 0 : sat_solver_var_value( p->pSat, nVarNum )));
//    Value = (!nVarNum)? Aig_ManRandom(0) & 1 : (Aig_IsComplement(pObjFraig) ^ sat_solver_var_value( p->pSat, nVarNum ));
    if ( p->pPars->fPolarFlip )
    {
        if ( Aig_Regular(pObjFraig)->fPhase )  Value ^= 1;
    }
    return Value;
}